

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  byte *srcBuffer;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  undefined2 uVar7;
  long lVar8;
  char cVar9;
  ulong uVar10;
  size_t sVar11;
  byte bVar12;
  ulong uVar13;
  undefined1 *puVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  undefined1 *puVar22;
  int iVar23;
  undefined1 *puVar24;
  int iVar25;
  undefined4 in_register_0000008c;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  bool bVar29;
  uint local_12c;
  ulong local_128;
  ulong local_120;
  ulong *local_110;
  ulong local_108;
  ulong *local_f8;
  BIT_DStream_t local_f0;
  undefined1 *local_c8;
  undefined8 local_c0;
  ulong *local_b8;
  undefined1 *local_b0;
  ulong *local_a8;
  undefined1 *local_a0;
  ulong *local_98;
  ulong *local_90;
  ulong *local_88;
  size_t local_80;
  ulong *local_78;
  ulong *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  ulong local_58;
  
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar11 = HUF_decompress4X1_usingDTable_internal_fast
                           (dst,dstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar11 != 0)) {
      return sVar11;
    }
    sVar11 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar11;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar4 = *cSrc;
  uVar26 = (ulong)uVar4;
  uVar5 = *(ushort *)((long)cSrc + 2);
  uVar13 = (ulong)uVar5;
  uVar6 = *(ushort *)((long)cSrc + 4);
  uVar10 = (ulong)uVar6;
  uVar17 = uVar26 + uVar13 + uVar10 + 6;
  if (dstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar17) {
    return 0xffffffffffffffec;
  }
  local_c8 = (undefined1 *)(dstSize + (long)dst);
  local_58 = dstSize + 3 >> 2;
  local_a0 = (undefined1 *)(local_58 + (long)dst);
  local_68 = local_a0 + local_58;
  local_60 = local_68 + local_58;
  if (local_c8 < local_60) {
    return 0xffffffffffffffec;
  }
  local_70 = (ulong *)((long)cSrc + uVar26 + 6);
  if (uVar26 == 0) {
    uVar18 = 0xffffffffffffffb8;
    local_b8 = (ulong *)0x0;
    local_a8 = (ulong *)0x0;
    local_88 = (ulong *)0x0;
    uVar28 = 0;
    local_108 = 0;
  }
  else {
    local_a8 = (ulong *)((long)cSrc + 6);
    local_88 = (ulong *)((long)cSrc + 0xe);
    if (uVar4 < 8) {
      local_108 = (ulong)*(byte *)local_a8;
      switch(uVar4) {
      case 7:
        local_108 = local_108 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
      case 6:
        local_108 = local_108 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
      case 5:
        local_108 = local_108 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
      case 4:
        local_108 = local_108 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
      case 3:
        local_108 = local_108 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
      case 2:
        local_108 = local_108 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
      default:
        bVar12 = *(byte *)((long)cSrc + uVar26 + 5);
        uVar27 = 0x1f;
        if (bVar12 != 0) {
          for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
          }
        }
        if (bVar12 == 0) {
          uVar18 = 0xffffffffffffffec;
          uVar27 = 0;
        }
        else {
          uVar27 = ~uVar27 + 9 + ((uint)uVar4 * -8 + 0x40 & 0xffff);
          uVar18 = uVar26;
        }
        uVar28 = (ulong)uVar27;
        local_b8 = local_a8;
      }
    }
    else {
      local_108 = *(ulong *)((long)cSrc + (uVar26 - 2));
      bVar12 = *(byte *)((long)cSrc + uVar26 + 5);
      uVar27 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uVar27 = ~uVar27 + 9;
      if (bVar12 == 0) {
        uVar27 = 0;
      }
      uVar28 = (ulong)uVar27;
      uVar18 = uVar26 | -(ulong)(bVar12 == 0);
      local_b8 = (ulong *)((long)cSrc + (uVar26 - 2));
    }
  }
  if (0xffffffffffffff88 < uVar18) {
    return uVar18;
  }
  local_78 = (ulong *)((long)local_70 + uVar13);
  if (uVar13 == 0) {
    uVar13 = 0xffffffffffffffb8;
    local_128 = 0;
    local_12c = 0;
    local_f8 = (ulong *)0x0;
    local_70 = (ulong *)0x0;
    local_90 = (ulong *)0x0;
  }
  else {
    local_90 = (ulong *)((long)cSrc + uVar26 + 0xe);
    if (7 < uVar5) {
      local_128 = local_78[-1];
      bVar12 = *(byte *)((long)local_78 + -1);
      uVar27 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      local_12c = ~uVar27 + 9;
      if (bVar12 == 0) {
        local_12c = 0;
      }
      uVar13 = uVar13 | -(ulong)(bVar12 == 0);
      local_f8 = local_78 + -1;
      goto LAB_0017d1bb;
    }
    local_128 = (ulong)(byte)*local_70;
    switch(uVar5) {
    case 2:
      goto LAB_0017d167;
    case 3:
      goto LAB_0017d15c;
    case 4:
      goto LAB_0017d151;
    case 5:
      goto LAB_0017d145;
    case 6:
      break;
    case 7:
      local_128 = local_128 | (ulong)*(byte *)((long)cSrc + uVar26 + 0xc) << 0x30;
      break;
    default:
      goto switchD_0017d103_default;
    }
    local_128 = local_128 + ((ulong)*(byte *)((long)cSrc + uVar26 + 0xb) << 0x28);
LAB_0017d145:
    local_128 = local_128 + ((ulong)*(byte *)((long)cSrc + uVar26 + 10) << 0x20);
LAB_0017d151:
    local_128 = local_128 + (ulong)*(byte *)((long)cSrc + uVar26 + 9) * 0x1000000;
LAB_0017d15c:
    local_128 = local_128 + (ulong)*(byte *)((long)cSrc + uVar26 + 8) * 0x10000;
LAB_0017d167:
    local_128 = local_128 + (ulong)*(byte *)((long)cSrc + uVar26 + 7) * 0x100;
switchD_0017d103_default:
    bVar12 = *(byte *)((long)local_78 + -1);
    uVar27 = 0x1f;
    if (bVar12 != 0) {
      for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
      }
    }
    local_f8 = local_70;
    if (bVar12 == 0) {
      uVar13 = 0xffffffffffffffec;
      local_12c = 0;
    }
    else {
      local_12c = ~uVar27 + 9 + ((uint)uVar5 * -8 + 0x40 & 0xffff);
    }
  }
LAB_0017d1bb:
  if (0xffffffffffffff88 < uVar13) {
    return uVar13;
  }
  srcBuffer = (byte *)((long)local_78 + uVar10);
  if (uVar10 == 0) {
    uVar10 = 0xffffffffffffffb8;
    local_120 = 0;
    local_c0 = (ulong)local_c0._4_4_ << 0x20;
    local_110 = (ulong *)0x0;
    local_78 = (ulong *)0x0;
    local_98 = (ulong *)0x0;
  }
  else {
    local_98 = local_78 + 1;
    if (7 < uVar6) {
      local_120 = *(ulong *)(srcBuffer + -8);
      bVar12 = srcBuffer[-1];
      uVar27 = 0x1f;
      if (bVar12 != 0) {
        for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      iVar15 = ~uVar27 + 9;
      if (bVar12 == 0) {
        iVar15 = 0;
      }
      local_c0 = CONCAT44(local_c0._4_4_,iVar15);
      uVar10 = uVar10 | -(ulong)(bVar12 == 0);
      local_110 = (ulong *)(srcBuffer + -8);
      goto LAB_0017d32a;
    }
    local_120 = (ulong)(byte)*local_78;
    switch(uVar6) {
    case 2:
      goto LAB_0017d2d7;
    case 3:
      goto LAB_0017d2cc;
    case 4:
      goto LAB_0017d2c1;
    case 5:
      goto LAB_0017d2b5;
    case 6:
      break;
    case 7:
      local_120 = local_120 | (ulong)*(byte *)((long)local_78 + 6) << 0x30;
      break;
    default:
      goto switchD_0017d273_default;
    }
    local_120 = local_120 + ((ulong)*(byte *)((long)local_78 + 5) << 0x28);
LAB_0017d2b5:
    local_120 = local_120 + ((ulong)*(byte *)((long)local_78 + 4) << 0x20);
LAB_0017d2c1:
    local_120 = local_120 + (ulong)*(byte *)((long)local_78 + 3) * 0x1000000;
LAB_0017d2cc:
    local_120 = local_120 + (ulong)*(byte *)((long)local_78 + 2) * 0x10000;
LAB_0017d2d7:
    local_120 = local_120 + (ulong)*(byte *)((long)local_78 + 1) * 0x100;
switchD_0017d273_default:
    bVar12 = srcBuffer[-1];
    uVar27 = 0x1f;
    if (bVar12 != 0) {
      for (; bVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
      }
    }
    if (bVar12 == 0) {
      uVar10 = 0xffffffffffffffec;
      iVar15 = 0;
    }
    else {
      iVar15 = ~uVar27 + 9 + ((uint)uVar6 * -8 + 0x40 & 0xffff);
    }
    local_c0 = CONCAT44(local_c0._4_4_,iVar15);
    local_110 = local_78;
  }
LAB_0017d32a:
  if (0xffffffffffffff88 < uVar10) {
    return uVar10;
  }
  uVar7 = *(undefined2 *)((long)DTable + 2);
  sVar11 = BIT_initDStream(&local_f0,srcBuffer,cSrcSize - uVar17);
  if (0xffffffffffffff88 < sVar11) {
    return sVar11;
  }
  puVar14 = (undefined1 *)((long)dst + (dstSize - 3));
  cVar9 = (char)uVar7;
  if (local_60 < puVar14 && 7 < (ulong)((long)local_c8 - (long)local_60)) {
    local_80 = local_f0.bitContainer;
    bVar12 = -cVar9 & 0x3f;
    lVar8 = local_58 * 3;
    do {
      puVar22 = (undefined1 *)dst;
      uVar10 = (local_108 << ((byte)uVar28 & 0x3f)) >> bVar12;
      uVar13 = (local_128 << ((byte)local_12c & 0x3f)) >> bVar12;
      uVar17 = (local_120 << ((byte)(uint)local_c0 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + (int)uVar28;
      uVar26 = (local_80 << ((byte)local_f0.bitsConsumed & 0x3f)) >> bVar12;
      uVar18 = (local_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      *puVar22 = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar21 = *(byte *)((long)DTable + uVar13 * 2 + 4) + local_12c;
      puVar22[local_58] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar23 = *(byte *)((long)DTable + uVar17 * 2 + 4) + (uint)local_c0;
      puVar22[local_58 * 2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      iVar25 = *(byte *)((long)DTable + uVar26 * 2 + 4) + local_f0.bitsConsumed;
      puVar22[lVar8] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      uVar10 = (local_128 << ((byte)iVar21 & 0x3f)) >> bVar12;
      uVar26 = (local_120 << ((byte)iVar23 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar18 * 2 + 4) + iVar15;
      uVar13 = (local_80 << ((byte)iVar25 & 0x3f)) >> bVar12;
      uVar17 = (local_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      puVar22[1] = *(undefined1 *)((long)DTable + uVar18 * 2 + 5);
      iVar21 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar21;
      puVar22[local_58 + 1] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 4) + iVar23;
      puVar22[local_58 * 2 + 1] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      iVar25 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar25;
      puVar22[lVar8 + 1] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar15;
      puVar22[2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      uVar10 = (local_128 << ((byte)iVar21 & 0x3f)) >> bVar12;
      uVar13 = (local_120 << ((byte)iVar23 & 0x3f)) >> bVar12;
      iVar21 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar21;
      uVar17 = (local_80 << ((byte)iVar25 & 0x3f)) >> bVar12;
      uVar26 = (local_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      puVar22[local_58 + 2] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar23 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar23;
      puVar22[local_58 * 2 + 2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar25 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar25;
      puVar22[lVar8 + 2] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      uVar27 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 4) + iVar15;
      puVar22[3] = *(undefined1 *)((long)DTable + uVar26 * 2 + 5);
      uVar10 = (local_128 << ((byte)iVar21 & 0x3f)) >> bVar12;
      bVar1 = *(byte *)((long)DTable + uVar10 * 2 + 4);
      puVar22[local_58 + 3] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_120 << ((byte)iVar23 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)DTable + uVar10 * 2 + 4);
      puVar22[local_58 * 2 + 3] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_80 << ((byte)iVar25 & 0x3f)) >> bVar12;
      bVar3 = *(byte *)((long)DTable + uVar10 * 2 + 4);
      puVar22[lVar8 + 3] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      iVar15 = 3;
      if (local_b8 < local_88) {
        iVar20 = 3;
      }
      else {
        local_b8 = (ulong *)((long)local_b8 - (ulong)(uVar27 >> 3));
        uVar27 = uVar27 & 7;
        local_108 = *local_b8;
        iVar20 = 0;
      }
      local_12c = iVar21 + (uint)bVar1;
      if (local_90 <= local_f8) {
        local_f8 = (ulong *)((long)local_f8 - (ulong)(local_12c >> 3));
        local_12c = local_12c & 7;
        local_128 = *local_f8;
        iVar15 = 0;
      }
      local_c0._0_4_ = iVar23 + (uint)bVar2;
      iVar23 = 3;
      if (local_110 < local_98) {
        iVar21 = 3;
      }
      else {
        local_110 = (ulong *)((long)local_110 - (ulong)((uint)local_c0 >> 3));
        local_c0._0_4_ = (uint)local_c0 & 7;
        local_120 = *local_110;
        iVar21 = 0;
      }
      local_f0.bitsConsumed = iVar25 + (uint)bVar3;
      if (local_f0.limitPtr <= local_f0.ptr) {
        local_f0.ptr = (char *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3));
        local_f0.bitsConsumed = local_f0.bitsConsumed & 7;
        local_f0.bitContainer = *(size_t *)local_f0.ptr;
        iVar23 = 0;
        local_80 = local_f0.bitContainer;
      }
      uVar28 = (ulong)uVar27;
    } while ((puVar22 + lVar8 + 4 < puVar14) &&
            (dst = puVar22 + 4, ((iVar15 == 0 && iVar20 == 0) && iVar21 == 0) && iVar23 == 0));
    dst = puVar22 + 4;
    local_b0 = (undefined1 *)((long)dst + lVar8);
    puVar22 = (undefined1 *)((long)dst + local_58 * 2);
    puVar24 = (undefined1 *)((long)dst + local_58);
  }
  else {
    local_b0 = local_60;
    puVar22 = local_68;
    puVar24 = local_a0;
  }
  if ((local_a0 < dst) || (local_68 < puVar24)) {
    return 0xffffffffffffffec;
  }
  uVar10 = (ulong)(uint)local_c0;
  if (local_60 < puVar22) {
    return 0xffffffffffffffec;
  }
  if (3 < (long)local_a0 - (long)dst) {
    bVar12 = -cVar9 & 0x3f;
    do {
      uVar27 = (uint)uVar28;
      if (uVar27 < 0x41) {
        if (local_b8 < local_88) {
          if (local_b8 == local_a8) goto LAB_0017d87f;
          bVar29 = local_a8 <= (ulong *)((long)local_b8 - (uVar28 >> 3));
          uVar19 = (int)local_b8 - (int)local_a8;
          if (bVar29) {
            uVar19 = (uint)(uVar28 >> 3);
          }
          uVar27 = uVar27 + uVar19 * -8;
        }
        else {
          uVar19 = (uint)(uVar28 >> 3);
          uVar27 = uVar27 & 7;
          bVar29 = true;
        }
        uVar28 = (ulong)uVar27;
        local_b8 = (ulong *)((long)local_b8 - (ulong)uVar19);
        local_108 = *local_b8;
      }
      else {
LAB_0017d87f:
        bVar29 = false;
      }
      if ((local_a0 + -3 <= dst) || (!bVar29)) goto LAB_0017da2b;
      uVar13 = (local_108 << ((byte)uVar28 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + (int)uVar28;
      uVar17 = (local_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar15;
      uVar13 = (local_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar15;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      uVar13 = (local_108 << ((byte)iVar15 & 0x3f)) >> bVar12;
      uVar28 = (ulong)((uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar15);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      dst = (void *)((long)dst + 4);
    } while( true );
  }
  uVar27 = (uint)uVar28;
  if (uVar27 < 0x41) {
    if (local_b8 < local_88) {
      if (local_b8 == local_a8) goto LAB_0017da2b;
      uVar19 = (int)local_b8 - (int)local_a8;
      if (local_a8 <= (ulong *)((long)local_b8 - (uVar28 >> 3))) {
        uVar19 = (uint)(uVar28 >> 3);
      }
      uVar27 = uVar27 + uVar19 * -8;
    }
    else {
      uVar19 = (uint)(uVar28 >> 3);
      uVar27 = uVar27 & 7;
    }
    uVar28 = (ulong)uVar27;
    local_b8 = (ulong *)((long)local_b8 - (ulong)uVar19);
    local_108 = *local_b8;
  }
LAB_0017da2b:
  uVar27 = (uint)uVar28;
  if (dst < local_a0) {
    do {
      uVar13 = (local_108 << ((byte)uVar28 & 0x3f)) >> (-cVar9 & 0x3fU);
      uVar27 = (int)uVar28 + (uint)*(byte *)((long)DTable + uVar13 * 2 + 4);
      uVar28 = (ulong)uVar27;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < local_a0);
  }
  if (3 < (long)local_68 - (long)puVar24) {
    bVar12 = -cVar9 & 0x3f;
    do {
      if (local_12c < 0x41) {
        if (local_f8 < local_90) {
          if (local_f8 == local_70) goto LAB_0017daa9;
          bVar29 = local_70 <= (ulong *)((long)local_f8 - (ulong)(local_12c >> 3));
          uVar19 = (int)local_f8 - (int)local_70;
          if (bVar29) {
            uVar19 = local_12c >> 3;
          }
          local_12c = local_12c + uVar19 * -8;
        }
        else {
          uVar19 = local_12c >> 3;
          local_12c = local_12c & 7;
          bVar29 = true;
        }
        local_f8 = (ulong *)((long)local_f8 - (ulong)uVar19);
        local_128 = *local_f8;
      }
      else {
LAB_0017daa9:
        bVar29 = false;
      }
      if ((local_68 + -3 <= puVar24) || (!bVar29)) goto LAB_0017dbf6;
      uVar13 = (local_128 << ((byte)local_12c & 0x3f)) >> bVar12;
      iVar15 = *(byte *)((long)DTable + uVar13 * 2 + 4) + local_12c;
      uVar17 = (local_128 << ((byte)iVar15 & 0x3f)) >> bVar12;
      *puVar24 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar15;
      uVar13 = (local_128 << ((byte)iVar15 & 0x3f)) >> bVar12;
      puVar24[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar15;
      puVar24[2] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      uVar13 = (local_128 << ((byte)iVar15 & 0x3f)) >> bVar12;
      local_12c = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar15;
      puVar24[3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      puVar24 = puVar24 + 4;
    } while( true );
  }
  if (local_12c < 0x41) {
    if (local_f8 < local_90) {
      if (local_f8 == local_70) goto LAB_0017dbf6;
      uVar19 = (int)local_f8 - (int)local_70;
      if (local_70 <= (ulong *)((long)local_f8 - (ulong)(local_12c >> 3))) {
        uVar19 = local_12c >> 3;
      }
      local_12c = local_12c + uVar19 * -8;
    }
    else {
      uVar19 = local_12c >> 3;
      local_12c = local_12c & 7;
    }
    local_f8 = (ulong *)((long)local_f8 - (ulong)uVar19);
    local_128 = *local_f8;
  }
LAB_0017dbf6:
  if (puVar24 < local_68) {
    do {
      uVar13 = (local_128 << ((byte)local_12c & 0x3f)) >> (-cVar9 & 0x3fU);
      local_12c = local_12c + *(byte *)((long)DTable + uVar13 * 2 + 4);
      *puVar24 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      puVar24 = puVar24 + 1;
    } while (puVar24 < local_68);
  }
  if (3 < (long)local_60 - (long)puVar22) {
    bVar12 = -cVar9 & 0x3f;
    do {
      uVar19 = (uint)uVar10;
      if (uVar19 < 0x41) {
        if (local_110 < local_98) {
          if (local_110 == local_78) goto LAB_0017dc6c;
          bVar29 = local_78 <= (ulong *)((long)local_110 - (uVar10 >> 3));
          uVar16 = (int)local_110 - (int)local_78;
          if (bVar29) {
            uVar16 = (uint)(uVar10 >> 3);
          }
          uVar19 = uVar19 + uVar16 * -8;
        }
        else {
          uVar16 = (uint)(uVar10 >> 3);
          uVar19 = uVar19 & 7;
          bVar29 = true;
        }
        uVar10 = (ulong)uVar19;
        local_110 = (ulong *)((long)local_110 - (ulong)uVar16);
        local_120 = *local_110;
      }
      else {
LAB_0017dc6c:
        bVar29 = false;
      }
      if ((local_60 + -3 <= puVar22) || (!bVar29)) goto LAB_0017ddb0;
      uVar13 = (local_120 << ((byte)uVar10 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + (int)uVar10;
      uVar17 = (local_120 << ((byte)iVar15 & 0x3f)) >> bVar12;
      *puVar22 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar17 * 2 + 4) + iVar15;
      uVar10 = (local_120 << ((byte)iVar15 & 0x3f)) >> bVar12;
      puVar22[1] = *(undefined1 *)((long)DTable + uVar17 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar15;
      puVar22[2] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar13 = (local_120 << ((byte)iVar15 & 0x3f)) >> bVar12;
      uVar10 = (ulong)((uint)*(byte *)((long)DTable + uVar13 * 2 + 4) + iVar15);
      puVar22[3] = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      puVar22 = puVar22 + 4;
    } while( true );
  }
  if ((uint)local_c0 < 0x41) {
    if (local_110 < local_98) {
      if (local_110 == local_78) goto LAB_0017ddb0;
      uVar19 = (int)local_110 - (int)local_78;
      if (local_78 <= (ulong *)((long)local_110 - (ulong)((uint)local_c0 >> 3))) {
        uVar19 = (uint)local_c0 >> 3;
      }
      local_c0._0_4_ = (uint)local_c0 + uVar19 * -8;
    }
    else {
      uVar19 = (uint)local_c0 >> 3;
      local_c0._0_4_ = (uint)local_c0 & 7;
    }
    uVar10 = (ulong)(uint)local_c0;
    local_110 = (ulong *)((long)local_110 - (ulong)uVar19);
    local_120 = *local_110;
  }
LAB_0017ddb0:
  uVar19 = (uint)uVar10;
  if (puVar22 < local_60) {
    do {
      uVar13 = (local_120 << ((byte)uVar10 & 0x3f)) >> (-cVar9 & 0x3fU);
      uVar19 = (int)uVar10 + (uint)*(byte *)((long)DTable + uVar13 * 2 + 4);
      uVar10 = (ulong)uVar19;
      *puVar22 = *(undefined1 *)((long)DTable + uVar13 * 2 + 5);
      puVar22 = puVar22 + 1;
    } while (puVar22 < local_60);
  }
  if (3 < (long)local_c8 - (long)local_b0) {
    bVar12 = -cVar9 & 0x3f;
    do {
      if (local_f0.bitsConsumed < 0x41) {
        if (local_f0.ptr < local_f0.limitPtr) {
          if (local_f0.ptr == local_f0.start) goto LAB_0017de21;
          bVar29 = local_f0.start <=
                   (size_t *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3));
          uVar16 = (int)local_f0.ptr - (int)local_f0.start;
          if (bVar29) {
            uVar16 = local_f0.bitsConsumed >> 3;
          }
          local_f0.ptr = (char *)((long)local_f0.ptr - (ulong)uVar16);
          local_f0.bitsConsumed = local_f0.bitsConsumed + uVar16 * -8;
          local_f0.bitContainer = *(size_t *)local_f0.ptr;
        }
        else {
          local_f0.ptr = (char *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3));
          local_f0.bitsConsumed = local_f0.bitsConsumed & 7;
          local_f0.bitContainer = *(size_t *)local_f0.ptr;
          bVar29 = true;
        }
      }
      else {
LAB_0017de21:
        bVar29 = false;
      }
      if ((puVar14 <= local_b0) || (!bVar29)) goto LAB_0017dfe3;
      uVar10 = (local_f0.bitContainer << ((byte)local_f0.bitsConsumed & 0x3f)) >> bVar12;
      iVar15 = *(byte *)((long)DTable + uVar10 * 2 + 4) + local_f0.bitsConsumed;
      *local_b0 = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_f0.bitContainer << ((byte)iVar15 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar15;
      local_b0[1] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_f0.bitContainer << ((byte)iVar15 & 0x3f)) >> bVar12;
      iVar15 = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar15;
      local_b0[2] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      uVar10 = (local_f0.bitContainer << ((byte)iVar15 & 0x3f)) >> bVar12;
      local_f0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar10 * 2 + 4) + iVar15;
      local_b0[3] = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      local_b0 = local_b0 + 4;
    } while( true );
  }
  if (local_f0.bitsConsumed < 0x41) {
    if (local_f0.ptr < local_f0.limitPtr) {
      if (local_f0.ptr == local_f0.start) goto LAB_0017dfe3;
      uVar16 = (int)local_f0.ptr - (int)local_f0.start;
      if (local_f0.start <= (size_t *)((long)local_f0.ptr - (ulong)(local_f0.bitsConsumed >> 3))) {
        uVar16 = local_f0.bitsConsumed >> 3;
      }
      local_f0.bitsConsumed = local_f0.bitsConsumed + uVar16 * -8;
    }
    else {
      uVar16 = local_f0.bitsConsumed >> 3;
      local_f0.bitsConsumed = local_f0.bitsConsumed & 7;
    }
    local_f0.ptr = (char *)((long)local_f0.ptr - (ulong)uVar16);
    local_f0.bitContainer = *(size_t *)local_f0.ptr;
  }
LAB_0017dfe3:
  if (local_b0 < local_c8) {
    do {
      uVar10 = (local_f0.bitContainer << ((byte)local_f0.bitsConsumed & 0x3f)) >> (-cVar9 & 0x3fU);
      local_f0.bitsConsumed = *(byte *)((long)DTable + uVar10 * 2 + 4) + local_f0.bitsConsumed;
      *local_b0 = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      local_b0 = local_b0 + 1;
    } while (local_b0 < local_c8);
  }
  if (local_f0.bitsConsumed != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_f0.ptr != local_f0.start) {
    dstSize = 0xffffffffffffffec;
  }
  if (uVar19 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_110 != local_78) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_12c != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_f8 != local_70) {
    dstSize = 0xffffffffffffffec;
  }
  if (uVar27 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_b8 != local_a8) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}